

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O0

bool __thiscall ON_Layer::Read(ON_Layer *this,ON_BinaryArchive *file)

{
  bool bVar1;
  SectionFillRule rule;
  int iVar2;
  uint uVar3;
  uint uVar4;
  wchar_t *component_name;
  bool local_481;
  undefined1 local_480 [7];
  bool b_1;
  ON_SectionStyle section_style_4;
  undefined1 local_3e0 [7];
  bool b;
  ON_Linetype lt;
  ON_SectionStyle section_style_3;
  undefined1 local_290 [7];
  uchar c;
  ON_SectionStyle section_style_2;
  double rotation;
  ON_SectionStyle section_style_1;
  double scale;
  ON_SectionStyle section_style;
  int pattern;
  ON_UuidList selectiveList;
  undefined1 uStack_88;
  bool noClippingPlanes;
  uchar itemid;
  uchar style;
  unsigned_short uStack_84;
  unsigned_short uStack_82;
  ON_UUID parent_layer_id;
  ON_UUID layer_id;
  ON_ComponentStatus local_5f;
  bool local_5d;
  int local_5c;
  ON_ComponentStatus local_57;
  bool bLocked;
  int line_pattern_index;
  bool bVisible;
  ON_wString local_48;
  ON_wString layer_name;
  double x;
  int iStack_30;
  short s;
  int render_material_index;
  int layer_index;
  int iStack_24;
  bool rc;
  int mode;
  int minor_version;
  int major_version;
  int obsolete_value1;
  ON_BinaryArchive *file_local;
  ON_Layer *this_local;
  
  minor_version = 0;
  mode = 0;
  iStack_24 = 0;
  layer_index = 0;
  _major_version = file;
  file_local = (ON_BinaryArchive *)this;
  operator=(this,&Unset);
  render_material_index._3_1_ =
       ON_BinaryArchive::Read3dmChunkVersion(_major_version,&mode,&stack0xffffffffffffffdc);
  if ((!(bool)render_material_index._3_1_) || (mode != 1)) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_layer.cpp"
               ,0x3b0,"","ON_Layer::Read() encountered a layer written by future code.");
    render_material_index._3_1_ = 0;
    goto LAB_0069b80c;
  }
  if ((bool)render_material_index._3_1_) {
    render_material_index._3_1_ = ON_BinaryArchive::ReadInt(_major_version,&layer_index);
  }
  if (((bool)render_material_index._3_1_ != false) && (layer_index != 0)) {
    if (layer_index == 1) {
      ON_ModelComponent::SetHiddenModelComponentState(&this->super_ON_ModelComponent,true);
    }
    else if (layer_index == 2) {
      ON_ModelComponent::SetLockedModelComponentState(&this->super_ON_ModelComponent,true);
    }
  }
  iStack_30 = ON_ModelComponent::Index(&this->super_ON_ModelComponent);
  if ((render_material_index._3_1_ & 1) != 0) {
    render_material_index._3_1_ = ON_BinaryArchive::ReadInt(_major_version,&stack0xffffffffffffffd0)
    ;
  }
  if ((render_material_index._3_1_ & 1) != 0) {
    ON_ModelComponent::SetIndex(&this->super_ON_ModelComponent,iStack_30);
  }
  if ((render_material_index._3_1_ & 1) != 0) {
    render_material_index._3_1_ = ON_BinaryArchive::ReadInt(_major_version,&this->m_iges_level);
  }
  x._4_4_ = -0x7fffffff;
  if ((render_material_index._3_1_ & 1) != 0) {
    render_material_index._3_1_ =
         ON_BinaryArchive::Read3dmReferencedComponentIndex
                   (_major_version,Material,(int *)((long)&x + 4));
  }
  if (((render_material_index._3_1_ & 1) != 0) && (x._4_4_ != -0x7fffffff)) {
    SetRenderMaterialIndex(this,x._4_4_);
  }
  if ((render_material_index._3_1_ & 1) != 0) {
    render_material_index._3_1_ = ON_BinaryArchive::ReadInt(_major_version,&minor_version);
  }
  if ((render_material_index._3_1_ & 1) != 0) {
    render_material_index._3_1_ = ON_BinaryArchive::ReadColor(_major_version,&this->m_color);
  }
  if (((render_material_index._3_1_ & 1) != 0) &&
     (iVar2 = ON_Color::Alpha(&this->m_color), iVar2 == 0xff)) {
    uVar3 = ON_Color::operator_cast_to_unsigned_int(&this->m_color);
    uVar4 = ON_Color::operator_cast_to_unsigned_int(&ON_Color::UnsetColor);
    if ((uVar3 != uVar4) &&
       (iVar2 = ON_BinaryArchive::Archive3dmVersion(_major_version), iVar2 < 0x46)) {
      ON_Color::SetAlpha(&this->m_color,0);
    }
  }
  if ((render_material_index._3_1_ & 1) != 0) {
    ON_BinaryArchive::ReadShort(_major_version,(ON__INT16 *)((long)&x + 2));
  }
  if ((render_material_index._3_1_ & 1) != 0) {
    ON_BinaryArchive::ReadShort(_major_version,(ON__INT16 *)((long)&x + 2));
  }
  if ((render_material_index._3_1_ & 1) != 0) {
    ON_BinaryArchive::ReadDouble(_major_version,(double *)&layer_name);
  }
  if ((render_material_index._3_1_ & 1) != 0) {
    ON_BinaryArchive::ReadDouble(_major_version,(double *)&layer_name);
  }
  ON_wString::ON_wString(&local_48);
  if ((render_material_index._3_1_ & 1) != 0) {
    render_material_index._3_1_ = ON_BinaryArchive::ReadString(_major_version,&local_48);
  }
  if ((render_material_index._3_1_ & 1) != 0) {
    component_name = ON_wString::operator_cast_to_wchar_t_(&local_48);
    ON_ModelComponent::SetName(&this->super_ON_ModelComponent,component_name);
  }
  if (((render_material_index._3_1_ & 1) != 0) && (0 < iStack_24)) {
    bLocked = true;
    render_material_index._3_1_ = ON_BinaryArchive::ReadBool(_major_version,&bLocked);
    if (((bool)render_material_index._3_1_) && ((bLocked & 1U) == 0)) {
      ON_ModelComponent::SetHiddenModelComponentState(&this->super_ON_ModelComponent,true);
    }
    local_57 = ON_ModelComponent::ModelComponentStatus(&this->super_ON_ModelComponent);
    bVar1 = ON_ComponentStatus::IsHidden(&local_57);
    bLocked = !bVar1;
    if (((render_material_index._3_1_ & 1) != 0) && (1 < iStack_24)) {
      local_5c = -0x7fffffff;
      render_material_index._3_1_ =
           ON_BinaryArchive::Read3dmReferencedComponentIndex(_major_version,LinePattern,&local_5c);
      if (((bool)render_material_index._3_1_) && (local_5c != -0x7fffffff)) {
        SetLinetypeIndex(this,local_5c);
      }
      if (((render_material_index._3_1_ & 1) != 0) && (2 < iStack_24)) {
        render_material_index._3_1_ =
             ON_BinaryArchive::ReadColor(_major_version,&this->m_plot_color);
        if ((bool)render_material_index._3_1_) {
          render_material_index._3_1_ =
               ON_BinaryArchive::ReadDouble(_major_version,&this->m_plot_weight_mm);
        }
        if (((bool)render_material_index._3_1_ != false) && (3 < iStack_24)) {
          local_5d = false;
          render_material_index._3_1_ = ON_BinaryArchive::ReadBool(_major_version,&local_5d);
          if (((bool)render_material_index._3_1_) && ((local_5d & 1U) != 0)) {
            ON_ModelComponent::SetLockedModelComponentState
                      (&this->super_ON_ModelComponent,(bool)(local_5d & 1));
          }
          local_5f = ON_ModelComponent::ModelComponentStatus(&this->super_ON_ModelComponent);
          local_5d = ON_ComponentStatus::IsLocked(&local_5f);
          if (((render_material_index._3_1_ & 1) != 0) && (4 < iStack_24)) {
            parent_layer_id.Data4 = (uchar  [8])0;
            render_material_index._3_1_ =
                 ON_BinaryArchive::ReadUuid(_major_version,(ON_UUID *)parent_layer_id.Data4);
            if ((bool)render_material_index._3_1_) {
              ON_ModelComponent::SetId
                        (&this->super_ON_ModelComponent,(ON_UUID *)parent_layer_id.Data4);
            }
            if ((((render_material_index._3_1_ & 1) != 0) && (5 < iStack_24)) &&
               (uVar3 = ON_BinaryArchive::ArchiveOpenNURBSVersion(_major_version), 0xbf37716 < uVar3
               )) {
              _uStack_88 = 0;
              uStack_84 = 0;
              uStack_82 = 0;
              parent_layer_id._0_8_ = (uchar  [8])0x0;
              render_material_index._3_1_ =
                   ON_BinaryArchive::ReadUuid(_major_version,(ON_UUID *)&uStack_88);
              if ((bool)render_material_index._3_1_) {
                ON_ModelComponent::SetParentId(&this->super_ON_ModelComponent,(ON_UUID *)&uStack_88)
                ;
                bVar1 = ON_UuidIsNotNil((ON_UUID *)&uStack_88);
                if (bVar1) {
                  selectiveList.m_removed_count._2_2_ =
                       ON_ModelComponent::ModelComponentStatus(&this->super_ON_ModelComponent);
                  bVar1 = ON_ComponentStatus::IsHidden
                                    ((ON_ComponentStatus *)
                                     ((long)&selectiveList.m_removed_count + 2));
                  if (bVar1) {
                    SetPersistentVisibility(this,false);
                  }
                  selectiveList.m_removed_count._0_2_ =
                       ON_ModelComponent::ModelComponentStatus(&this->super_ON_ModelComponent);
                  bVar1 = ON_ComponentStatus::IsLocked
                                    ((ON_ComponentStatus *)&selectiveList.m_removed_count);
                  if (bVar1) {
                    SetPersistentLocking(this,true);
                  }
                }
                render_material_index._3_1_ =
                     ON_BinaryArchive::ReadBool(_major_version,&this->m_bExpanded);
              }
            }
            if ((((render_material_index._3_1_ & 1) != 0) && (6 < iStack_24)) &&
               ((render_material_index._3_1_ =
                      ON_RenderingAttributes::Read(&this->m_rendering_attributes,_major_version),
                (bool)render_material_index._3_1_ && (7 < iStack_24)))) {
              render_material_index._3_1_ =
                   ON_BinaryArchive::ReadUuid(_major_version,&this->m_display_material_id);
              if (((bool)render_material_index._3_1_) && (iStack_24 == 9)) {
                selectiveList.m_sorted_count._3_1_ = 0;
                render_material_index._3_1_ =
                     ON_BinaryArchive::ReadChar
                               (_major_version,
                                (ON__UINT8 *)((long)&selectiveList.m_sorted_count + 3));
                if ((bool)render_material_index._3_1_) {
                  selectiveList.m_sorted_count._3_1_ = 0;
                  render_material_index._3_1_ =
                       ON_BinaryArchive::ReadChar
                                 (_major_version,
                                  (ON__UINT8 *)((long)&selectiveList.m_sorted_count + 3));
                }
              }
              if (((bool)render_material_index._3_1_ != false) && (9 < iStack_24)) {
                selectiveList.m_sorted_count._2_1_ = 0xff;
                if (((bool)render_material_index._3_1_ != false) &&
                   ((render_material_index._3_1_ =
                          ON_BinaryArchive::ReadChar
                                    (_major_version,
                                     (ON__UINT8 *)((long)&selectiveList.m_sorted_count + 2)),
                    (bool)render_material_index._3_1_ && (selectiveList.m_sorted_count._2_1_ != 0)))
                   ) {
                  if (selectiveList.m_sorted_count._2_1_ == 0x1c) {
                    selectiveList.m_sorted_count._1_1_ = 0;
                    ON_UuidList::ON_UuidList((ON_UuidList *)&pattern);
                    render_material_index._3_1_ =
                         ON_BinaryArchive::ReadBool
                                   (_major_version,(bool *)((long)&selectiveList.m_sorted_count + 1)
                                   );
                    if ((bool)render_material_index._3_1_) {
                      render_material_index._3_1_ =
                           ON_UuidList::Read((ON_UuidList *)&pattern,_major_version);
                      if ((bool)render_material_index._3_1_) {
                        render_material_index._3_1_ =
                             ON_BinaryArchive::ReadChar
                                       (_major_version,
                                        (ON__UINT8 *)((long)&selectiveList.m_sorted_count + 2));
                        if (((bool)render_material_index._3_1_) &&
                           (selectiveList.m_sorted_count._2_1_ != 0)) {
                          section_style.m_private._4_4_ = 0;
                        }
                        else {
                          section_style.m_private._4_4_ = 4;
                        }
                      }
                      else {
                        section_style.m_private._4_4_ = 4;
                      }
                    }
                    else {
                      section_style.m_private._4_4_ = 4;
                    }
                    ON_UuidList::~ON_UuidList((ON_UuidList *)&pattern);
                    if (section_style.m_private._4_4_ != 0) goto LAB_0069b759;
                  }
                  if (10 < iStack_24) {
                    if (selectiveList.m_sorted_count._2_1_ == 0x1d) {
                      section_style.m_private._0_4_ = 0;
                      render_material_index._3_1_ =
                           ON_BinaryArchive::Read3dmReferencedComponentIndex
                                     (_major_version,HatchPattern,(int *)&section_style.m_private);
                      if ((bool)render_material_index._3_1_) {
                        ON_SectionStyle::ON_SectionStyle((ON_SectionStyle *)&scale);
                        CustomSectionStyle(this,(ON_SectionStyle *)&scale);
                        ON_SectionStyle::SetHatchIndex
                                  ((ON_SectionStyle *)&scale,(int)section_style.m_private);
                        SetCustomSectionStyle(this,(ON_SectionStyle *)&scale);
                        render_material_index._3_1_ =
                             ON_BinaryArchive::ReadChar
                                       (_major_version,
                                        (ON__UINT8 *)((long)&selectiveList.m_sorted_count + 2));
                        if (((bool)render_material_index._3_1_) &&
                           (selectiveList.m_sorted_count._2_1_ != 0)) {
                          section_style.m_private._4_4_ = 0;
                        }
                        else {
                          section_style.m_private._4_4_ = 4;
                        }
                        ON_SectionStyle::~ON_SectionStyle((ON_SectionStyle *)&scale);
                        if (section_style.m_private._4_4_ == 0) goto LAB_0069b0a3;
                      }
                    }
                    else {
LAB_0069b0a3:
                      if (selectiveList.m_sorted_count._2_1_ == 0x1e) {
                        section_style_1.m_private = (ON_SectionStylePrivate *)0x3ff0000000000000;
                        render_material_index._3_1_ =
                             ON_BinaryArchive::ReadDouble
                                       (_major_version,(double *)&section_style_1.m_private);
                        if ((bool)render_material_index._3_1_) {
                          ON_SectionStyle::ON_SectionStyle((ON_SectionStyle *)&rotation);
                          CustomSectionStyle(this,(ON_SectionStyle *)&rotation);
                          ON_SectionStyle::SetHatchScale
                                    ((ON_SectionStyle *)&rotation,(double)section_style_1.m_private)
                          ;
                          SetCustomSectionStyle(this,(ON_SectionStyle *)&rotation);
                          render_material_index._3_1_ =
                               ON_BinaryArchive::ReadChar
                                         (_major_version,
                                          (ON__UINT8 *)((long)&selectiveList.m_sorted_count + 2));
                          if (((bool)render_material_index._3_1_) &&
                             (selectiveList.m_sorted_count._2_1_ != 0)) {
                            section_style.m_private._4_4_ = 0;
                          }
                          else {
                            section_style.m_private._4_4_ = 4;
                          }
                          ON_SectionStyle::~ON_SectionStyle((ON_SectionStyle *)&rotation);
                          if (section_style.m_private._4_4_ == 0) goto LAB_0069b1d1;
                        }
                      }
                      else {
LAB_0069b1d1:
                        if (selectiveList.m_sorted_count._2_1_ == 0x1f) {
                          section_style_2.m_private = (ON_SectionStylePrivate *)0x0;
                          render_material_index._3_1_ =
                               ON_BinaryArchive::ReadDouble
                                         (_major_version,(double *)&section_style_2.m_private);
                          if ((bool)render_material_index._3_1_) {
                            ON_SectionStyle::ON_SectionStyle((ON_SectionStyle *)local_290);
                            CustomSectionStyle(this,(ON_SectionStyle *)local_290);
                            ON_SectionStyle::SetHatchRotation
                                      ((ON_SectionStyle *)local_290,
                                       (double)section_style_2.m_private);
                            SetCustomSectionStyle(this,(ON_SectionStyle *)local_290);
                            render_material_index._3_1_ =
                                 ON_BinaryArchive::ReadChar
                                           (_major_version,
                                            (ON__UINT8 *)((long)&selectiveList.m_sorted_count + 2));
                            if (((bool)render_material_index._3_1_) &&
                               (selectiveList.m_sorted_count._2_1_ != 0)) {
                              section_style.m_private._4_4_ = 0;
                            }
                            else {
                              section_style.m_private._4_4_ = 4;
                            }
                            ON_SectionStyle::~ON_SectionStyle((ON_SectionStyle *)local_290);
                            if (section_style.m_private._4_4_ == 0) goto LAB_0069b2f9;
                          }
                        }
                        else {
LAB_0069b2f9:
                          if (0xb < iStack_24) {
                            if (selectiveList.m_sorted_count._2_1_ == 0x20) {
                              section_style_3.m_private._7_1_ = 0;
                              render_material_index._3_1_ =
                                   ON_BinaryArchive::ReadChar
                                             (_major_version,
                                              (ON__UINT8 *)((long)&section_style_3.m_private + 7));
                              if ((bool)render_material_index._3_1_) {
                                ON_SectionStyle::ON_SectionStyle
                                          ((ON_SectionStyle *)&lt.m_width_units);
                                CustomSectionStyle(this,(ON_SectionStyle *)&lt.m_width_units);
                                rule = ON::SectionFillRuleFromUnsigned
                                                 ((uint)section_style_3.m_private._7_1_);
                                ON_SectionStyle::SetSectionFillRule
                                          ((ON_SectionStyle *)&lt.m_width_units,rule);
                                SetCustomSectionStyle(this,(ON_SectionStyle *)&lt.m_width_units);
                                render_material_index._3_1_ =
                                     ON_BinaryArchive::ReadChar
                                               (_major_version,
                                                (ON__UINT8 *)
                                                ((long)&selectiveList.m_sorted_count + 2));
                                if (((bool)render_material_index._3_1_) &&
                                   (selectiveList.m_sorted_count._2_1_ != 0)) {
                                  section_style.m_private._4_4_ = 0;
                                }
                                else {
                                  section_style.m_private._4_4_ = 4;
                                }
                                ON_SectionStyle::~ON_SectionStyle
                                          ((ON_SectionStyle *)&lt.m_width_units);
                                if (section_style.m_private._4_4_ == 0) goto LAB_0069b43d;
                              }
                            }
                            else {
LAB_0069b43d:
                              if (0xc < iStack_24) {
                                if (selectiveList.m_sorted_count._2_1_ == 0x21) {
                                  ON_Linetype::ON_Linetype((ON_Linetype *)local_3e0);
                                  render_material_index._3_1_ =
                                       ON_Linetype::Read((ON_Linetype *)local_3e0,_major_version);
                                  if ((bool)render_material_index._3_1_) {
                                    render_material_index._3_1_ =
                                         ON_BinaryArchive::ReadChar
                                                   (_major_version,
                                                    (ON__UINT8 *)
                                                    ((long)&selectiveList.m_sorted_count + 2));
                                    if (((bool)render_material_index._3_1_) &&
                                       (selectiveList.m_sorted_count._2_1_ != 0)) {
                                      section_style.m_private._4_4_ = 0;
                                    }
                                    else {
                                      section_style.m_private._4_4_ = 4;
                                    }
                                  }
                                  else {
                                    section_style.m_private._4_4_ = 4;
                                  }
                                  ON_Linetype::~ON_Linetype((ON_Linetype *)local_3e0);
                                  if (section_style.m_private._4_4_ != 0) goto LAB_0069b759;
                                }
                                if (0xd < iStack_24) {
                                  if (selectiveList.m_sorted_count._2_1_ == 0x22) {
                                    section_style_4.m_private._7_1_ = 1;
                                    render_material_index._3_1_ =
                                         ON_BinaryArchive::ReadBool
                                                   (_major_version,
                                                    (bool *)((long)&section_style_4.m_private + 7));
                                    if ((bool)render_material_index._3_1_) {
                                      SetPerViewportIsVisibleInNewDetails
                                                (this,(bool)(section_style_4.m_private._7_1_ & 1));
                                      render_material_index._3_1_ =
                                           ON_BinaryArchive::ReadChar
                                                     (_major_version,
                                                      (ON__UINT8 *)
                                                      ((long)&selectiveList.m_sorted_count + 2));
                                      if (((bool)render_material_index._3_1_) &&
                                         (selectiveList.m_sorted_count._2_1_ != 0))
                                      goto LAB_0069b5d5;
                                    }
                                  }
                                  else {
LAB_0069b5d5:
                                    if (0xe < iStack_24) {
                                      if (selectiveList.m_sorted_count._2_1_ == 0x23) {
                                        ON_SectionStyle::ON_SectionStyle
                                                  ((ON_SectionStyle *)local_480);
                                        render_material_index._3_1_ =
                                             ON_SectionStyle::Read
                                                       ((ON_SectionStyle *)local_480,_major_version)
                                        ;
                                        if ((bool)render_material_index._3_1_) {
                                          SetCustomSectionStyle(this,(ON_SectionStyle *)local_480);
                                          render_material_index._3_1_ =
                                               ON_BinaryArchive::ReadChar
                                                         (_major_version,
                                                          (ON__UINT8 *)
                                                          ((long)&selectiveList.m_sorted_count + 2))
                                          ;
                                          if (((bool)render_material_index._3_1_) &&
                                             (selectiveList.m_sorted_count._2_1_ != 0)) {
                                            section_style.m_private._4_4_ = 0;
                                          }
                                          else {
                                            section_style.m_private._4_4_ = 4;
                                          }
                                        }
                                        else {
                                          section_style.m_private._4_4_ = 4;
                                        }
                                        ON_SectionStyle::~ON_SectionStyle
                                                  ((ON_SectionStyle *)local_480);
                                        if (section_style.m_private._4_4_ != 0) goto LAB_0069b759;
                                      }
                                      if (selectiveList.m_sorted_count._2_1_ == 0x24) {
                                        local_481 = true;
                                        ON_BinaryArchive::ReadBool(_major_version,&local_481);
                                        if ((((render_material_index._3_1_ & 1) == 0) ||
                                            (render_material_index._3_1_ =
                                                  ON_BinaryArchive::ReadChar
                                                            (_major_version,
                                                             (ON__UINT8 *)
                                                             ((long)&selectiveList.m_sorted_count +
                                                             2)), !(bool)render_material_index._3_1_
                                            )) || (selectiveList.m_sorted_count._2_1_ == 0))
                                        goto LAB_0069b759;
                                      }
                                      if (0x24 < selectiveList.m_sorted_count._2_1_) {
                                        selectiveList.m_sorted_count._2_1_ = 0;
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
LAB_0069b759:
                if (((render_material_index._3_1_ & 1) != 0) &&
                   (selectiveList.m_sorted_count._2_1_ != 0)) {
                  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_layer.cpp"
                             ,0x39c,"","Bug in ON_Layer::Read or Write");
                }
              }
            }
          }
        }
      }
    }
  }
  bVar1 = ON_ModelComponent::IdIsNil(&this->super_ON_ModelComponent);
  if (bVar1) {
    ON_ModelComponent::SetId(&this->super_ON_ModelComponent);
  }
  ON_wString::~ON_wString(&local_48);
LAB_0069b80c:
  return (bool)(render_material_index._3_1_ & 1);
}

Assistant:

bool ON_Layer::Read(
       ON_BinaryArchive& file // restore definition from binary archive
     )
{
  int obsolete_value1 = 0; // see ON_Layer::Write
  int major_version=0;
  int minor_version=0;
  int mode = ON::normal_layer;
  *this = ON_Layer::Unset;
  bool rc = file.Read3dmChunkVersion(&major_version,&minor_version);
  if ( rc && major_version == 1 )
  {
    // common to all 1.x formats
    if ( rc ) rc = file.ReadInt( &mode );
    if ( rc ) 
    {
      switch(mode)
      {
      case 0: // OBSOLETE ON::normal_layer
        break;
      case 1: // OBSOLETE ON::hidden_layer
        SetHiddenModelComponentState(true);
        break;
      case 2: // OBSOLETE ON::locked_layer
        SetLockedModelComponentState( true );
        break;
      default:
        break;
      }
    }
    int layer_index = Index();
    if (rc)
    {
      // this is the archive layer index - it will probably change when the
      // layer is added to the model. Since the layer has not been added to
      // the model, there is not way to automatically update it at this time.
      rc = file.ReadInt(&layer_index);
    }
    if (rc)
      SetIndex(layer_index);

    if ( rc ) rc = file.ReadInt( &m_iges_level );

    // render material index
    int render_material_index = ON_UNSET_INT_INDEX;
    if (rc) 
      rc = file.Read3dmReferencedComponentIndex(ON_ModelComponent::Type::RenderMaterial,&render_material_index);
    if (rc && ON_UNSET_INT_INDEX != render_material_index )
      SetRenderMaterialIndex(render_material_index);

    if ( rc ) rc = file.ReadInt( &obsolete_value1 );
    if ( rc ) rc = file.ReadColor( m_color );

    // 25 Aug 2021 S. Baer (RH-65410)
    // Pre-V7 files ignored alpha on layer colors and in some cases
    // alpha was being set to completely transparent. In this case,
    // make the color opaque. Even V7 files with completely transparent
    // color is strange, but it can be intentionally set for some reason
    if (rc && m_color.Alpha() == 255 && m_color != ON_Color::UnsetColor && file.Archive3dmVersion() < 70)
    {
      m_color.SetAlpha(0);
    }

    {
      // OBSOLETE line style was never used - read and discard the next 20 bytes
      short s;
      double x;
      if (rc) file.ReadShort(&s);
      if (rc) file.ReadShort(&s);
      if (rc) file.ReadDouble(&x);
      if (rc) file.ReadDouble(&x);
    }

    ON_wString layer_name;
    if ( rc ) rc = file.ReadString( layer_name );
    if (rc)
      SetName(layer_name);

    if ( rc && minor_version >= 1 )
    {
      bool bVisible = true;
      rc = file.ReadBool(&bVisible);
      if ( rc && false == bVisible)
        SetHiddenModelComponentState(true);
      bVisible = (false == ModelComponentStatus().IsHidden());

      if ( rc && minor_version >= 2 )
      {
        // line pattern index
        int line_pattern_index = ON_UNSET_INT_INDEX;
        rc = file.Read3dmReferencedComponentIndex( ON_ModelComponent::Type::LinePattern, &line_pattern_index );
        if (rc && ON_UNSET_INT_INDEX != line_pattern_index)
          SetLinetypeIndex(line_pattern_index);

        if (rc && minor_version >= 3 )
        {
          // 23 March 2005 Dale Lear
          rc = file.ReadColor( m_plot_color);
          if (rc) rc = file.ReadDouble( &m_plot_weight_mm);

          if (rc && minor_version >= 4 )
          {
            bool bLocked = false;
            rc = file.ReadBool(&bLocked);
            if (rc && bLocked )
              SetLockedModelComponentState(bLocked);
            bLocked = ModelComponentStatus().IsLocked();

            if (rc && minor_version >= 5 )
            {
              ON_UUID layer_id = ON_nil_uuid;
              rc = file.ReadUuid(layer_id);
              if (rc)
                SetId(layer_id);
              if ( rc
                   && minor_version >= 6
                   && file.ArchiveOpenNURBSVersion() > 200505110
                 )
              {
                // Some files saved with opennurbs version 200505110 
                // do not contain correctly written m_parent_layer_id
                // and m_bExpanded values.
                // It is ok to default these values.
                ON_UUID parent_layer_id = ON_nil_uuid;
                rc = file.ReadUuid(parent_layer_id);
                if (rc)
                {
                  SetParentId(parent_layer_id);
                  if ( ON_UuidIsNotNil(parent_layer_id) )
                  {
                    //SetParentId(parent_layer_id);
                    if ( ModelComponentStatus().IsHidden() )
                      SetPersistentVisibility(false);
                    if ( ModelComponentStatus().IsLocked())
                      SetPersistentLocking(true);
                  }
                  rc = file.ReadBool(&m_bExpanded);
                }
              }

              if ( rc && minor_version >= 7 )
              {
                // 1.7 field - added 6 June 2006
                rc = m_rendering_attributes.Read(file);

                if ( rc && minor_version >= 8 )
                {
                  // 1.8 field - added 19 Sep 2006
                  rc = file.ReadUuid(m_display_material_id);

                  if (rc && minor_version == 9)
                  {
                    // 1.9 field - added 11 Aug 2021 and removed on 12 Aug 2021
                    // Note above that we are looking specifically at minor_version of 9
                    // read two chars and throw them away.
                    // minor_version >= 10 should skip this entirely
                    unsigned char style = 0;
                    rc = file.ReadChar(&style);
                    if (rc)
                    {
                      style = 0;
                      rc = file.ReadChar(&style);
                    }
                  }

                  if (rc && minor_version >= 10)
                  {
                    unsigned char itemid = 0xFF;
                    while (rc)
                    {
                      rc = file.ReadChar(&itemid);
                      if (!rc) break;
                      if (0 == itemid)
                        break;

                      if (ON_LayerTypeCodes::ObsoleteSelectiveClippingData == itemid) //28
                      {
                        bool noClippingPlanes = false;
                        ON_UuidList selectiveList;
                        rc = file.ReadBool(&noClippingPlanes);
                        if (!rc) break;
                        rc = selectiveList.Read(file);
                        if (!rc) break;
                        //if (noClippingPlanes)
                        //  SetClipParticipationForNone();
                        //else if (selectiveList.Count() > 0)
                        //  SetClipParticipationList(selectiveList.Array(), selectiveList.Count(), true);
                        //else
                        //  SetClipParticipationForAll();

                        rc = file.ReadChar(&itemid);
                        if (!rc || 0 == itemid) break;
                      }

                      if (minor_version <= 10)
                        break;

                      if (ON_LayerTypeCodes::SectionHatchIndex == itemid) // 30
                      {
                        int pattern = 0;
                        rc = file.Read3dmReferencedComponentIndex(ON_ModelComponent::Type::HatchPattern, &pattern);
                        if (!rc) break;
                        ON_SectionStyle section_style;
                        CustomSectionStyle(&section_style);
                        section_style.SetHatchIndex(pattern);
                        SetCustomSectionStyle(section_style);
                        rc = file.ReadChar(&itemid);
                        if (!rc || 0 == itemid) break;
                      }

                      if (ON_LayerTypeCodes::SectionHatchScale == itemid) // 31
                      {
                        double scale = 1;
                        rc = file.ReadDouble(&scale);
                        if (!rc) break;
                        ON_SectionStyle section_style;
                        CustomSectionStyle(&section_style);
                        section_style.SetHatchScale(scale);
                        SetCustomSectionStyle(section_style);
                        rc = file.ReadChar(&itemid);
                        if (!rc || 0 == itemid) break;
                      }

                      if (ON_LayerTypeCodes::SectionHatchRotation == itemid) // 32
                      {
                        double rotation = 0;
                        rc = file.ReadDouble(&rotation);
                        if (!rc) break;
                        ON_SectionStyle section_style;
                        CustomSectionStyle(&section_style);
                        section_style.SetHatchRotation(rotation);
                        SetCustomSectionStyle(section_style);
                        rc = file.ReadChar(&itemid);
                        if (!rc || 0 == itemid) break;
                      }

                      if (minor_version <= 11)
                        break;

                      if (ON_LayerTypeCodes::SectionFillRule == itemid)
                      {
                        unsigned char c = 0;
                        rc = file.ReadChar(&c);
                        if (!rc) break;
                        ON_SectionStyle section_style;
                        CustomSectionStyle(&section_style);
                        section_style.SetSectionFillRule(ON::SectionFillRuleFromUnsigned(c));
                        SetCustomSectionStyle(section_style);
                        rc = file.ReadChar(&itemid);
                        if (!rc || 0 == itemid) break;
                      }

                      if (minor_version <= 12)
                        break;

                      if (ON_LayerTypeCodes::CustomLinetype == itemid)
                      {
                        ON_Linetype lt;
                        rc = lt.Read(file);
                        if (!rc) break;
                        // 17 Feb 2023 S. Baer
                        // Custom linetype per layer was a short lived experiment
                        // We still need to read a linetype out of the few 3dm files
                        // that have them, but we no longer set any sort of custom linetype
                        //SetCustomLinetype(lt);
                        rc = file.ReadChar(&itemid);
                        if (!rc || 0 == itemid) break;
                      }

                      if (minor_version <= 13)
                        break;

                      // visible in new detail (1.14)
                      if (ON_LayerTypeCodes::PerViewportIsVisibleInNewDetails == itemid)
                      {
                        bool b = true;
                        rc = file.ReadBool(&b);
                        if (!rc) break;
                        SetPerViewportIsVisibleInNewDetails(b);
                        rc = file.ReadChar(&itemid);
                        if (!rc || 0 == itemid) break;
                      }

                      if (minor_version <= 14)
                        break;

                      if (ON_LayerTypeCodes::CustomSectionStyle == itemid)
                      {
                        ON_SectionStyle section_style;
                        rc = section_style.Read(file);
                        if (!rc) break;
                        SetCustomSectionStyle(section_style);
                        rc = file.ReadChar(&itemid);
                        if (!rc || 0 == itemid) break;
                      }

                      if (ON_LayerTypeCodes::ObsoleteSelectiveClippingListType == itemid)
                      {
                        bool b = true;
                        file.ReadBool(&b);
                        if (!rc) break;
                        //if (nullptr == m_private)
                        //  m_private = new ON_LayerPrivate();
                        //m_private->m_clipplane_list_is_participation = b;

                        rc = file.ReadChar(&itemid);
                        if (!rc || 0 == itemid) break;
                      }

                      // Add new item reading above and increment the LastLayerTypeCode value
                      // in the enum. Be sure to test reading of old and new files by old and new
                      // code, before checking in your changes.
                      if (itemid > ON_LayerTypeCodes::LastLayerTypeCode)
                      {
                        // we are reading file written with code newer than this code
                        itemid = 0;
                      }

                      break;
                    }

                    if (rc && 0 != itemid)
                    {
                      ON_ERROR("Bug in ON_Layer::Read or Write");
                    }

                  }
                }
              }
            }
          }
        }
      }
    }

    if ( IdIsNil()  )
    {
      // old files didn't have layer ids and we need unique ones.
      SetId();
    }
  }
  else
  {
    ON_ERROR("ON_Layer::Read() encountered a layer written by future code.");
    rc = false;
  }

  return rc;
}